

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O1

PAL_ERROR __thiscall CorUnix::CPalString::CopyString(CPalString *this,CPalString *psSource)

{
  WCHAR *__dest;
  PAL_ERROR PVar1;
  
  if (psSource == (CPalString *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x30);
    fprintf(_stderr,"Expression: NULL != psSource\n");
  }
  if (this->m_pwsz != (WCHAR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x31);
    fprintf(_stderr,"Expression: NULL == m_pwsz\n");
  }
  if (this->m_dwStringLength != 0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x32);
    fprintf(_stderr,"Expression: 0 == m_dwStringLength\n");
  }
  if (this->m_dwMaxLength != 0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x33);
    fprintf(_stderr,"Expression: 0 == m_dwMaxLength\n");
  }
  PVar1 = 0;
  if (psSource->m_dwStringLength != 0) {
    if (psSource->m_dwMaxLength <= psSource->m_dwStringLength) {
      fprintf(_stderr,"] %s %s:%d","CopyString",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
              ,0x37);
      fprintf(_stderr,"Expression: psSource->GetMaxLength() > psSource->GetStringLength()\n");
    }
    __dest = (WCHAR *)InternalMalloc((ulong)psSource->m_dwMaxLength * 2);
    if (__dest == (WCHAR *)0x0) {
      PVar1 = 0xe;
    }
    else {
      if (psSource->m_pwsz == (WCHAR *)0x0) {
        fprintf(_stderr,"] %s %s:%d","CopyString",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
                ,0x3f);
        fprintf(_stderr,"Expression: NULL != psSource->GetString()\n");
      }
      memcpy(__dest,psSource->m_pwsz,(ulong)psSource->m_dwMaxLength * 2);
      this->m_pwsz = __dest;
      this->m_dwStringLength = psSource->m_dwStringLength;
      this->m_dwMaxLength = psSource->m_dwMaxLength;
      PVar1 = 0;
    }
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CPalString::CopyString(
    CPalString *psSource
    )
{
    PAL_ERROR palError = NO_ERROR;
        
    _ASSERTE(NULL != psSource);
    _ASSERTE(NULL == m_pwsz);
    _ASSERTE(0 == m_dwStringLength);
    _ASSERTE(0 == m_dwMaxLength);

    if (0 != psSource->GetStringLength())
    {
        _ASSERTE(psSource->GetMaxLength() > psSource->GetStringLength());
        
        WCHAR *pwsz = reinterpret_cast<WCHAR*>(
            InternalMalloc(psSource->GetMaxLength() * sizeof(WCHAR))
            );

        if (NULL != pwsz)
        {
            _ASSERTE(NULL != psSource->GetString());

            CopyMemory(
                pwsz,
                psSource->GetString(),
                psSource->GetMaxLength() * sizeof(WCHAR)
                );

            m_pwsz = pwsz;
            m_dwStringLength = psSource->GetStringLength();
            m_dwMaxLength = psSource->GetMaxLength();
        }
        else
        {
            palError = ERROR_OUTOFMEMORY;
        }
    }

    return palError;
}